

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimSnapshotManager.cpp
# Opt level: O0

bool __thiscall OpenMD::SimSnapshotManager::resetToPrevious(SimSnapshotManager *this)

{
  int id;
  Snapshot *in_RDI;
  int prevID;
  undefined4 in_stack_fffffffffffffff0;
  
  id = Snapshot::getID((Snapshot *)
                       (in_RDI->atomData).velocity.
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  Snapshot::operator=((Snapshot *)CONCAT44(id,in_stack_fffffffffffffff0),in_RDI);
  Snapshot::setID((Snapshot *)
                  (in_RDI->atomData).velocity.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,id);
  return true;
}

Assistant:

bool SimSnapshotManager::resetToPrevious() {
    int prevID        = previousSnapshot_->getID();
    *currentSnapshot_ = *previousSnapshot_;
    currentSnapshot_->setID(prevID);
    return true;
  }